

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::ConvertSchnorrPubkey(ByteData256 *__return_storage_ptr__,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  undefined8 uVar2;
  CfdException *this;
  allocator local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_bytes;
  string local_48;
  
  uVar2 = wally_get_secp_context();
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result_bytes,0x20,
             (allocator_type *)&local_48);
  iVar1 = secp256k1_xonly_pubkey_serialize
                    (uVar2,result_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,pubkey);
  if (iVar1 == 1) {
    ByteData256::ByteData256(__return_storage_ptr__,&result_bytes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_48,"Secp256k1 serialize exception",&local_61);
  CfdException::CfdException(this,kCfdInternalError,&local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 ConvertSchnorrPubkey(const secp256k1_xonly_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(SchnorrPubkey::kSchnorrPubkeySize);
  int ret =
      secp256k1_xonly_pubkey_serialize(ctx, result_bytes.data(), &pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return ByteData256(result_bytes);
}